

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O2

int verify_struct(flatbuffers_uoffset_t end,flatbuffers_uoffset_t base,flatbuffers_uoffset_t offset,
                 flatbuffers_uoffset_t size,uint16_t align)

{
  int iVar1;
  uint uVar2;
  
  if ((offset != 0) && (uVar2 = offset + base, uVar2 <= end)) {
    if (CARRY4(size,uVar2)) {
      iVar1 = 10;
    }
    else {
      if (size + uVar2 <= end) {
        iVar1 = 0xb;
        if ((align - 1 & uVar2) == 0) {
          iVar1 = 0;
        }
        return iVar1;
      }
      iVar1 = 9;
    }
    return iVar1;
  }
  return 0x12;
}

Assistant:

static inline int verify_struct(uoffset_t end, uoffset_t base, uoffset_t offset, uoffset_t size, uint16_t align)
{
    /* Structs can have zero size so `end` is a valid value. */
    if (offset == 0 || base + offset > end) {
        return flatcc_verify_error_offset_out_of_range;
    }
    base += offset;
    verify(base + size >= base, flatcc_verify_error_struct_size_overflow);
    verify(base + size <= end, flatcc_verify_error_struct_out_of_range);
    verify (!(base & (align - 1u)), flatcc_verify_error_struct_unaligned);
    return flatcc_verify_ok;
}